

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void str_clean_whitespaces(char *str_in)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  
  pcVar1 = str_in + -1;
  do {
    pcVar2 = pcVar1 + 1;
    pcVar1 = pcVar1 + 1;
  } while (*pcVar2 == ' ');
  while( true ) {
    bVar4 = true;
    pcVar2 = pcVar1;
    while( true ) {
      pcVar1 = pcVar2 + 1;
      cVar3 = *pcVar2;
      if (cVar3 != ' ') break;
      bVar4 = false;
      pcVar2 = pcVar1;
    }
    if (cVar3 == '\0') break;
    if (!bVar4) {
      *str_in = ' ';
      str_in = str_in + 1;
      cVar3 = *pcVar2;
    }
    *str_in = cVar3;
    str_in = str_in + 1;
  }
  *str_in = '\0';
  return;
}

Assistant:

void str_clean_whitespaces(char *str_in)
{
	char *read = str_in;
	char *write = str_in;

	/* skip initial whitespace */
	while(*read == ' ')
		read++;

	/* end of read string is detected in the loop */
	while(1)
	{
		/* skip whitespace */
		int found_whitespace = 0;
		for(; *read == ' '; read++)
			found_whitespace = 1;
		/* if not at the end of the string, put a found whitespace here */
		if(*read)
		{
			if(found_whitespace)
				*write++ = ' ';
			*write++ = *read++;
		}
		else
		{
			*write = 0;
			break;
		}
	}
}